

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nes_Vrc6.cpp
# Opt level: O1

void __thiscall Nes_Vrc6::run_saw(Nes_Vrc6 *this,cpu_time_t end_time)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  Blip_Buffer *buf;
  int iVar4;
  int delta;
  uint uVar5;
  long lVar6;
  int iVar7;
  
  buf = this->oscs[2].output;
  if (buf != (Blip_Buffer *)0x0) {
    iVar4 = this->oscs[2].last_amp;
    uVar5 = this->oscs[2].amp;
    lVar6 = this->last_time;
    if (((char)this->oscs[2].regs[2] < '\0') &&
       (bVar1 = this->oscs[2].regs[0], uVar5 != 0 || (bVar1 & 0x3f) != 0)) {
      lVar6 = lVar6 + this->oscs[2].delay;
      if (lVar6 < end_time) {
        bVar2 = this->oscs[2].regs[2];
        bVar3 = this->oscs[2].regs[1];
        iVar7 = this->oscs[2].phase;
        do {
          iVar7 = iVar7 + -1;
          if (iVar7 == 0) {
            iVar7 = 7;
            uVar5 = 0;
          }
          delta = ((int)uVar5 >> 3) - iVar4;
          if (delta != 0) {
            Blip_Synth<2,_31>::offset(&this->saw_synth,lVar6,delta,buf);
            iVar4 = (int)uVar5 >> 3;
          }
          uVar5 = uVar5 + (bVar1 & 0x3f) & 0xff;
          lVar6 = lVar6 + (ulong)((bVar2 & 0xf) * 0x200 + (uint)bVar3 * 2) + 2;
        } while (lVar6 < end_time);
        this->oscs[2].phase = iVar7;
        this->oscs[2].amp = uVar5;
      }
      this->oscs[2].delay = (int)lVar6 - (int)end_time;
      iVar7 = iVar4;
    }
    else {
      this->oscs[2].delay = 0;
      iVar7 = (int)uVar5 >> 3;
      Blip_Synth<2,_31>::offset(&this->saw_synth,lVar6,iVar7 - iVar4,buf);
    }
    this->oscs[2].last_amp = iVar7;
  }
  return;
}

Assistant:

void Nes_Vrc6::run_saw( cpu_time_t end_time )
{
	Vrc6_Osc& osc = oscs [2];
	Blip_Buffer* output = osc.output;
	if ( !output )
		return;
	
	int amp = osc.amp;
	int amp_step = osc.regs [0] & 0x3F;
	cpu_time_t time = last_time;
	int last_amp = osc.last_amp;
	if ( !(osc.regs [2] & 0x80) || !(amp_step | amp) )
	{
		osc.delay = 0;
		int delta = (amp >> 3) - last_amp;
		last_amp = amp >> 3;
		saw_synth.offset( time, delta, output );
	}
	else
	{
		time += osc.delay;
		if ( time < end_time )
		{
			int period = osc.period() * 2;
			int phase = osc.phase;
			
			do
			{
				if ( --phase == 0 )
				{
					phase = 7;
					amp = 0;
				}
				
				int delta = (amp >> 3) - last_amp;
				if ( delta )
				{
					last_amp = amp >> 3;
					saw_synth.offset( time, delta, output );
				}
				
				time += period;
				amp = (amp + amp_step) & 0xFF;
			}
			while ( time < end_time );
			
			osc.phase = phase;
			osc.amp = amp;
		}
		
		osc.delay = time - end_time;
	}
	
	osc.last_amp = last_amp;
}